

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDimple::LocalSubdivide(ON_SubDimple *this,ON_SubDFace **face_list,size_t face_list_count)

{
  ushort uVar1;
  ON_ComponentStatus OVar2;
  ON_SubDLevel *this_00;
  double dVar3;
  double dVar4;
  ON_SubDEdgeSharpness OVar5;
  ON_SubDEdgeSharpness this_01;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ON_SubDLevel **ppOVar9;
  double *pdVar10;
  ON_SubDEdge *pOVar11;
  float (*pafVar12) [2];
  ON_3dPoint *pOVar13;
  ON_SubDFace **ppOVar14;
  ON_SubDVertex *pOVar15;
  ON_SubDVertex *pOVar16;
  ON_SubDEdge **ppOVar17;
  ON_SubDFace *pOVar18;
  ON_SubDFace *q;
  ON_SubDEdgePtr qbdry [4];
  uint local_29c;
  uint fei_4;
  ON_SubDEdge *r [2];
  ON_SubDEdge *r_1;
  uint fei_3;
  ON_SubDVertex *center;
  unsigned_short fei_2;
  ON_SubDVertex *ev [2];
  ON_SubDEdge *e_2;
  uint fei_1;
  ON_ComponentStatus fstatus;
  ON_SubDEdgePtr *pOStack_238;
  uint candidate_face_id;
  ON_SubDEdgePtr *eptrs;
  uint e_count;
  ON_SubDFace *f_2;
  undefined1 local_218 [4];
  uint fdex;
  ON_SimpleArray<ON_SubDEdge_*> radial_edges;
  ON_SimpleArray<ON_SubDEdgePtr> fbdry;
  ON_SubDEdge *new_edge;
  ON_SubDEdgeSharpness e_sharpness;
  ON_SubDEdge *e_1;
  uint edex;
  ON_SubDVertex *v;
  double local_188;
  double local_180;
  ON_SubDVertex *local_178;
  ON_SubDVertex *v0;
  ON_3dPoint local_168;
  ON_SubDVertex *local_150;
  ON_SubDEdge *e0;
  ON_SimpleArray<ON_SubDEdge_*> edges;
  ON_SimpleArray<ON_3dPoint> edge_points;
  ON_3dPoint local_110;
  ON_SubDFace *local_f8;
  ON_SubDFace *local_f0;
  ON_SubDFace *f0;
  undefined1 local_d8 [8];
  ON_SimpleArray<ON_3dPoint> face_points;
  ON_SimpleArray<ON_SubDFace_*> faces;
  uint evi;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_90;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  ON_SubDFace *f_1;
  size_t i_1;
  ON_3dPoint P;
  uint local_54;
  uint local_50;
  uint vertex_count;
  uint edge_count;
  uint face_count;
  ON_SubDLevel *level0;
  ON_SubDFace *f;
  size_t i;
  uint level0_index;
  size_t face_list_count_local;
  ON_SubDFace **face_list_local;
  ON_SubDimple *this_local;
  
  if (((face_list == (ON_SubDFace **)0x0) || (face_list_count == 0)) ||
     (uVar7 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels), uVar7 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    i._4_4_ = 0xffffffff;
    for (f = (ON_SubDFace *)0x0; f < face_list_count;
        f = (ON_SubDFace *)((long)&(f->super_ON_SubDComponentBase).m_subd_point1 + 1)) {
      pOVar18 = face_list[(long)f];
      if ((pOVar18 != (ON_SubDFace *)0x0) && (2 < pOVar18->m_edge_count)) {
        uVar7 = ON_SubDComponentBase::SubdivisionLevel(&pOVar18->super_ON_SubDComponentBase);
        uVar8 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
        if (uVar7 < uVar8) {
          i._4_4_ = ON_SubDComponentBase::SubdivisionLevel(&pOVar18->super_ON_SubDComponentBase);
          break;
        }
      }
    }
    uVar7 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
    if ((i._4_4_ < uVar7) &&
       (ppOVar9 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,i._4_4_),
       *ppOVar9 != (ON_SubDLevel *)0x0)) {
      ClearHigherSubdivisionLevels(this,i._4_4_ + 1);
      uVar7 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
      if (i._4_4_ + 1 == uVar7) {
        ppOVar9 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,i._4_4_);
        this->m_active_level = *ppOVar9;
        if ((this->m_active_level == (ON_SubDLevel *)0x0) ||
           (this->m_active_level->m_face_count == 0)) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
        else {
          ppOVar9 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,i._4_4_);
          this_00 = *ppOVar9;
          this->m_active_level = this_00;
          ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,true);
          vertex_count = 0;
          local_50 = 0;
          local_54 = 0;
          for (f_1 = (ON_SubDFace *)0x0; f_1 < face_list_count;
              f_1 = (ON_SubDFace *)((long)&(f_1->super_ON_SubDComponentBase).m_subd_point1 + 1)) {
            pOVar18 = face_list[(long)f_1];
            if ((((pOVar18 != (ON_SubDFace *)0x0) && (2 < pOVar18->m_edge_count)) &&
                (uVar7 = ON_SubDComponentBase::SubdivisionLevel
                                   (&pOVar18->super_ON_SubDComponentBase), i._4_4_ == uVar7)) &&
               (bVar6 = ON_ComponentStatus::RuntimeMark
                                  (&(pOVar18->super_ON_SubDComponentBase).m_status), !bVar6)) {
              ON_ComponentStatus::SetRuntimeMark(&(pOVar18->super_ON_SubDComponentBase).m_status);
              pdVar10 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&i_1);
              bVar6 = ON_SubDFace::GetSubdivisionPoint(pOVar18,pdVar10);
              if (!bVar6) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              pOStack_90 = pOVar18->m_edge4;
              for (e._6_2_ = 0; e._6_2_ < pOVar18->m_edge_count; e._6_2_ = e._6_2_ + 1) {
                if ((e._6_2_ == 4) &&
                   (pOStack_90 = pOVar18->m_edgex, pOStack_90 == (ON_SubDEdgePtr *)0x0)) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                pOVar11 = (ON_SubDEdge *)(pOStack_90->m_ptr & 0xfffffffffffffff8);
                if (((pOVar11 == (ON_SubDEdge *)0x0) ||
                    (pOVar11->m_vertex[0] == (ON_SubDVertex *)0x0)) ||
                   (pOVar11->m_vertex[1] == (ON_SubDVertex *)0x0)) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                bVar6 = ON_ComponentStatus::RuntimeMark
                                  (&(pOVar11->super_ON_SubDComponentBase).m_status);
                if (!bVar6) {
                  ON_SubDEdge::UpdateEdgeSectorCoefficientsForExperts(pOVar11,true);
                  ON_ComponentStatus::SetRuntimeMark
                            (&(pOVar11->super_ON_SubDComponentBase).m_status);
                  pdVar10 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&i_1);
                  bVar6 = ON_SubDEdge::GetSubdivisionPoint(pOVar11,pdVar10);
                  if (!bVar6) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  for (faces.m_capacity = 0; (uint)faces.m_capacity < 2;
                      faces.m_capacity = faces.m_capacity + 1) {
                    bVar6 = ON_ComponentStatus::RuntimeMark
                                      (&(pOVar11->m_vertex[(uint)faces.m_capacity]->
                                        super_ON_SubDComponentBase).m_status);
                    if (!bVar6) {
                      ON_ComponentStatus::SetRuntimeMark
                                (&(pOVar11->m_vertex[(uint)faces.m_capacity]->
                                  super_ON_SubDComponentBase).m_status);
                      pOVar15 = pOVar11->m_vertex[(uint)faces.m_capacity];
                      pdVar10 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&i_1);
                      bVar6 = ON_SubDVertex::GetSubdivisionPoint(pOVar15,pdVar10);
                      if (!bVar6) {
                        ON_SubDIncrementErrorCount();
                        return false;
                      }
                      local_54 = local_54 + 1;
                    }
                  }
                  local_50 = local_50 + 1;
                }
                pOStack_90 = pOStack_90 + 1;
              }
              vertex_count = vertex_count + 1;
            }
          }
          if (((vertex_count == 0) || (local_50 < 3)) || (local_54 < 3)) {
            this_local._7_1_ = false;
          }
          else if (vertex_count < this_00->m_face_count) {
            ON_SimpleArray<ON_SubDFace_*>::ON_SimpleArray
                      ((ON_SimpleArray<ON_SubDFace_*> *)&face_points.m_count,(ulong)vertex_count);
            ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                      ((ON_SimpleArray<ON_3dPoint> *)local_d8,(ulong)vertex_count);
            ChangeGeometryContentSerialNumber(this,false);
            for (local_f0 = this_00->m_face[0]; local_f0 != (ON_SubDFace *)0x0;
                local_f0 = local_f0->m_next_face) {
              bVar6 = ON_ComponentStatus::RuntimeMark
                                (&(local_f0->super_ON_SubDComponentBase).m_status);
              if (bVar6) {
                local_f8 = local_f0;
                ON_SimpleArray<ON_SubDFace_*>::Append
                          ((ON_SimpleArray<ON_SubDFace_*> *)&face_points.m_count,&local_f8);
                ON_SubDFace::SubdivisionPoint(&local_110,local_f0);
                P.y = local_110.z;
                i_1 = (size_t)local_110.x;
                P.x = local_110.y;
                bVar6 = ON_3dPoint::IsValid((ON_3dPoint *)&i_1);
                if (!bVar6) {
                  ON_SubDIncrementErrorCount();
                  this_local._7_1_ = false;
                  goto LAB_0088f463;
                }
                ON_SimpleArray<ON_3dPoint>::Append
                          ((ON_SimpleArray<ON_3dPoint> *)local_d8,(ON_3dPoint *)&i_1);
              }
            }
            uVar7 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                              ((ON_SimpleArray<ON_3dPoint> *)local_d8);
            if (vertex_count == uVar7) {
              ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                        ((ON_SimpleArray<ON_3dPoint> *)&edges.m_count,(ulong)local_50);
              ON_SimpleArray<ON_SubDEdge_*>::ON_SimpleArray
                        ((ON_SimpleArray<ON_SubDEdge_*> *)&e0,(ulong)local_50);
              for (local_150 = (ON_SubDVertex *)this_00->m_edge[0];
                  local_150 != (ON_SubDVertex *)0x0; local_150 = local_150->m_next_vertex) {
                bVar6 = ON_ComponentStatus::RuntimeMark
                                  (&(local_150->super_ON_SubDComponentBase).m_status);
                if (bVar6) {
                  bVar6 = ON_SubDEdge::IsSmooth((ON_SubDEdge *)local_150);
                  if (((bVar6) && (*(short *)&local_150->m_interior_crease_vertex_sharpness == 2))
                     && (uVar7 = ON_SubDEdge::MarkedFaceCount((ON_SubDEdge *)local_150), uVar7 == 2)
                     ) {
                    ON_SubDEdge::SubdivisionPoint(&local_168,(ON_SubDEdge *)local_150);
                  }
                  else {
                    ON_SubDEdge::ControlNetCenterPoint(&local_168,(ON_SubDEdge *)local_150);
                  }
                  P.y = local_168.z;
                  i_1 = (size_t)local_168.x;
                  P.x = local_168.y;
                  ON_SimpleArray<ON_3dPoint>::Append
                            ((ON_SimpleArray<ON_3dPoint> *)&edges.m_count,(ON_3dPoint *)&i_1);
                  v0 = local_150;
                  ON_SimpleArray<ON_SubDEdge_*>::Append
                            ((ON_SimpleArray<ON_SubDEdge_*> *)&e0,(ON_SubDEdge **)&v0);
                }
              }
              uVar7 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                ((ON_SimpleArray<ON_3dPoint> *)&edges.m_count);
              if (local_50 == uVar7) {
                for (local_178 = this_00->m_vertex[0]; local_178 != (ON_SubDVertex *)0x0;
                    local_178 = local_178->m_next_vertex) {
                  bVar6 = ON_ComponentStatus::RuntimeMark
                                    (&(local_178->super_ON_SubDComponentBase).m_status);
                  if (((bVar6) && (1 < local_178->m_edge_count)) &&
                     (uVar1 = local_178->m_edge_count,
                     uVar7 = ON_SubDVertex::MarkedEdgeCount(local_178), uVar1 == uVar7)) {
                    ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)&v,local_178);
                    i_1 = (size_t)v;
                    P.x = local_188;
                    P.y = local_180;
                    local_178->m_P[0] = (double)v;
                    local_178->m_P[1] = local_188;
                    local_178->m_P[2] = local_180;
                  }
                }
                for (e_1._4_4_ = 0; e_1._4_4_ < local_50; e_1._4_4_ = e_1._4_4_ + 1) {
                  pafVar12 = (float (*) [2])
                             ON_SimpleArray<ON_SubDEdge_*>::operator[]
                                       ((ON_SimpleArray<ON_SubDEdge_*> *)&e0,e_1._4_4_);
                  e_sharpness.m_edge_sharpness = *pafVar12;
                  new_edge = (ON_SubDEdge *)
                             ON_SubDEdge::Sharpness
                                       ((ON_SubDEdge *)e_sharpness.m_edge_sharpness,false);
                  ON_SubDEdge::EdgeModifiedNofification((ON_SubDEdge *)e_sharpness.m_edge_sharpness)
                  ;
                  OVar5 = e_sharpness;
                  pOVar13 = ON_SimpleArray<ON_3dPoint>::operator[]
                                      ((ON_SimpleArray<ON_3dPoint> *)&edges.m_count,e_1._4_4_);
                  pOVar11 = SplitEdge(this,(ON_SubDEdge *)OVar5.m_edge_sharpness,*pOVar13);
                  if (pOVar11 == (ON_SubDEdge *)0x0) {
                    ON_SubDIncrementErrorCount();
                    this_local._7_1_ = false;
                    goto LAB_0088f42f;
                  }
                  ON_ComponentStatus::ClearRuntimeMark
                            (&(pOVar11->super_ON_SubDComponentBase).m_status);
                  ON_ComponentStatus::SetRuntimeMark
                            ((ON_ComponentStatus *)((long)e_sharpness.m_edge_sharpness + 0x10));
                  this_01 = e_sharpness;
                  dVar3 = ON_SubDEdgeSharpness::operator[]((ON_SubDEdgeSharpness *)&new_edge,0);
                  dVar4 = ON_SubDEdgeSharpness::Average((ON_SubDEdgeSharpness *)&new_edge);
                  OVar5 = ON_SubDEdgeSharpness::FromInterval(dVar3,dVar4);
                  ON_SubDEdge::SetSharpnessForExperts((ON_SubDEdge *)this_01.m_edge_sharpness,OVar5)
                  ;
                  dVar3 = ON_SubDEdgeSharpness::Average((ON_SubDEdgeSharpness *)&new_edge);
                  dVar4 = ON_SubDEdgeSharpness::operator[]((ON_SubDEdgeSharpness *)&new_edge,1);
                  OVar5 = ON_SubDEdgeSharpness::FromInterval(dVar3,dVar4);
                  ON_SubDEdge::SetSharpnessForExperts(pOVar11,OVar5);
                }
                ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
                          ((ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count,0x20);
                ON_SimpleArray<ON_SubDEdge_*>::ON_SimpleArray
                          ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,0x20);
                for (f_2._4_4_ = 0; f_2._4_4_ < vertex_count; f_2._4_4_ = f_2._4_4_ + 1) {
                  ppOVar14 = ON_SimpleArray<ON_SubDFace_*>::operator[]
                                       ((ON_SimpleArray<ON_SubDFace_*> *)&face_points.m_count,
                                        f_2._4_4_);
                  pOVar18 = *ppOVar14;
                  ON_SubDFace::FaceModifiedNofification(pOVar18);
                  pOVar13 = ON_SimpleArray<ON_3dPoint>::operator[]
                                      ((ON_SimpleArray<ON_3dPoint> *)local_d8,f_2._4_4_);
                  P.y = pOVar13->z;
                  i_1 = (size_t)pOVar13->x;
                  P.x = pOVar13->y;
                  ON_SimpleArray<ON_SubDEdgePtr>::SetCount
                            ((ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count,0);
                  uVar7 = ON_SubDFace::GetEdgeArray
                                    (pOVar18,(ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count
                                    );
                  if ((uVar7 < 6) || ((uVar7 & 1) != 0)) {
                    ON_SubDIncrementErrorCount();
                    this_local._7_1_ = false;
                    goto LAB_0088f407;
                  }
                  pOStack_238 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                          ((ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count);
                  pOVar15 = ON_SubDEdgePtr::RelativeVertex(pOStack_238,0);
                  if (pOVar15 != (ON_SubDVertex *)0x0) {
                    pOVar15 = ON_SubDEdgePtr::RelativeVertex(pOStack_238,0);
                    bVar6 = ON_SubDComponentBase::Mark(&pOVar15->super_ON_SubDComponentBase);
                    if (!bVar6) {
                      ON_SimpleArray<ON_SubDEdgePtr>::Append
                                ((ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count,pOStack_238
                                );
                      pOStack_238 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                              ((ON_SimpleArray<ON_SubDEdgePtr> *)
                                               &radial_edges.m_count);
                      pOStack_238 = pOStack_238 + 1;
                    }
                  }
                  fei_1 = (pOVar18->super_ON_SubDComponentBase).m_id;
                  OVar2 = (pOVar18->super_ON_SubDComponentBase).m_status;
                  for (e_2._4_4_ = 0; e_2._4_4_ < uVar7; e_2._4_4_ = e_2._4_4_ + 1) {
                    pOVar11 = ON_SubDEdgePtr::Edge(pOStack_238 + e_2._4_4_);
                    if (pOVar11 == (ON_SubDEdge *)0x0) {
                      ON_SubDIncrementErrorCount();
                      this_local._7_1_ = false;
                      goto LAB_0088f407;
                    }
                    pOVar15 = ON_SubDEdgePtr::RelativeVertex(pOStack_238 + e_2._4_4_,0);
                    pOVar16 = ON_SubDEdgePtr::RelativeVertex(pOStack_238 + e_2._4_4_,1);
                    if (((pOVar15 == (ON_SubDVertex *)0x0) || (pOVar16 == (ON_SubDVertex *)0x0)) ||
                       (pOVar15 == pOVar16)) {
                      ON_SubDIncrementErrorCount();
                      this_local._7_1_ = false;
                      goto LAB_0088f407;
                    }
                    if ((e_2._4_4_ & 1) == 0) {
                      bVar6 = ON_SubDComponentBase::Mark(&pOVar15->super_ON_SubDComponentBase);
                      if (!bVar6) {
                        ON_SubDIncrementErrorCount();
                        this_local._7_1_ = false;
                        goto LAB_0088f407;
                      }
                      bVar6 = ON_SubDComponentBase::Mark(&pOVar16->super_ON_SubDComponentBase);
                      if (bVar6) {
                        ON_SubDIncrementErrorCount();
                        this_local._7_1_ = false;
                        goto LAB_0088f407;
                      }
                    }
                    else {
                      bVar6 = ON_SubDComponentBase::Mark(&pOVar15->super_ON_SubDComponentBase);
                      if (bVar6) {
                        ON_SubDIncrementErrorCount();
                        this_local._7_1_ = false;
                        goto LAB_0088f407;
                      }
                      bVar6 = ON_SubDComponentBase::Mark(&pOVar16->super_ON_SubDComponentBase);
                      if (!bVar6) {
                        ON_SubDIncrementErrorCount();
                        this_local._7_1_ = false;
                        goto LAB_0088f407;
                      }
                    }
                  }
                  for (center._6_2_ = 0; center._6_2_ < pOVar18->m_edge_count;
                      center._6_2_ = center._6_2_ + 1) {
                    pOVar11 = ON_SubDEdgePtr::Edge(pOStack_238 + center._6_2_);
                    ON_SubDEdge::RemoveFaceFromArray(pOVar11,pOVar18);
                    pOVar15 = ON_SubDEdgePtr::RelativeVertex(pOStack_238 + center._6_2_,0);
                    ON_SubDVertex::RemoveFaceFromArray(pOVar15,pOVar18);
                  }
                  ReturnFace(this,pOVar18);
                  pOVar15 = AllocateVertex(this,Smooth,i._4_4_,(double *)&i_1);
                  AddVertexToLevel(this,pOVar15);
                  ON_SimpleArray<ON_SubDEdge_*>::SetCount
                            ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,0);
                  ON_SimpleArray<ON_SubDEdge_*>::Reserve
                            ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,(ulong)(uVar7 >> 1));
                  for (r_1._4_4_ = 0; r_1._4_4_ < uVar7; r_1._4_4_ = r_1._4_4_ + 2) {
                    pOVar16 = ON_SubDEdgePtr::RelativeVertex(pOStack_238 + r_1._4_4_,1);
                    r[1] = AddEdge(this,Smooth,pOVar15,-8883.0,pOVar16,-8883.0);
                    ON_SimpleArray<ON_SubDEdge_*>::Append
                              ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,r + 1);
                  }
                  ppOVar17 = ON_SimpleArray<ON_SubDEdge_*>::operator[]
                                       ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,(uVar7 >> 1) - 1)
                  ;
                  r[0] = *ppOVar17;
                  for (local_29c = 0; pOVar11 = r[0], local_29c < uVar7; local_29c = local_29c + 2)
                  {
                    ppOVar17 = ON_SimpleArray<ON_SubDEdge_*>::operator[]
                                         ((ON_SimpleArray<ON_SubDEdge_*> *)local_218,local_29c >> 1)
                    ;
                    r[0] = *ppOVar17;
                    q = (ON_SubDFace *)ON_SubDEdgePtr::Create(pOVar11,0);
                    qbdry[0].m_ptr =
                         pOStack_238[(ulong)((local_29c - 1) + uVar7) % (ulong)uVar7].m_ptr;
                    qbdry[1].m_ptr = pOStack_238[local_29c].m_ptr;
                    qbdry[2] = ON_SubDEdgePtr::Create(r[0],1);
                    pOVar18 = AddFace(this,fei_1,4,(ON_SubDEdgePtr *)&q);
                    fei_1 = 0;
                    (pOVar18->super_ON_SubDComponentBase).m_status = OVar2;
                  }
                }
                ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,false);
                ON_SubDLevel::ClearBoundingBox(this_00);
                ON_SubDLevel::ClearEvaluationCache(this_00);
                ON_SubDLevel::ClearEdgeFlags(this_00);
                if (this->m_active_level != (ON_SubDLevel *)0x0) {
                  ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this->m_active_level,true);
                }
                this_local._7_1_ = true;
LAB_0088f407:
                ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray
                          ((ON_SimpleArray<ON_SubDEdge_*> *)local_218);
                ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray
                          ((ON_SimpleArray<ON_SubDEdgePtr> *)&radial_edges.m_count);
              }
              else {
                ON_SubDIncrementErrorCount();
                this_local._7_1_ = false;
              }
LAB_0088f42f:
              ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdge_*> *)&e0);
              ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray
                        ((ON_SimpleArray<ON_3dPoint> *)&edges.m_count);
            }
            else {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
            }
LAB_0088f463:
            ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)local_d8);
            ON_SimpleArray<ON_SubDFace_*>::~ON_SimpleArray
                      ((ON_SimpleArray<ON_SubDFace_*> *)&face_points.m_count);
          }
          else {
            uVar7 = GlobalSubdivide(this);
            this_local._7_1_ = uVar7 != 0;
          }
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDimple::LocalSubdivide(
  ON_SubDFace const*const* face_list,
  size_t face_list_count
)
{
  if (nullptr == face_list || face_list_count < 1 || m_levels.UnsignedCount() < 1)
    return false;

  unsigned int level0_index = ON_UNSET_UINT_INDEX;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || f->SubdivisionLevel() >= m_levels.UnsignedCount())
      continue;
    level0_index = f->SubdivisionLevel();
    break;
  }
  
  if (level0_index >= m_levels.UnsignedCount() || nullptr == m_levels[level0_index])
    return ON_SUBD_RETURN_ERROR(false);

  ClearHigherSubdivisionLevels(level0_index + 1);
  if (level0_index + 1 != m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_active_level = m_levels[level0_index];
  if ( nullptr == m_active_level || 0 == m_active_level->m_face_count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDLevel& level0 = *m_levels[level0_index];
  m_active_level = &level0;

  level0.ClearRuntimeMarks(true, true, true);

  unsigned face_count = 0;
  unsigned edge_count = 0;
  unsigned vertex_count = 0;
  ON_3dPoint P;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || level0_index != f->SubdivisionLevel() )
      continue;
    if (f->m_status.RuntimeMark())
      continue;
    f->m_status.SetRuntimeMark();
    if ( false == f->GetSubdivisionPoint(P))
      return ON_SUBD_RETURN_ERROR(false);
    const ON_SubDEdgePtr* eptr = f->m_edge4;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
    {
      if (4 == fei)
      {
        eptr = f->m_edgex;
        if (nullptr == eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (e->m_status.RuntimeMark())
        continue;
      e->UpdateEdgeSectorCoefficientsForExperts(true);
      e->m_status.SetRuntimeMark();
      if (false == e->GetSubdivisionPoint(P))
        return ON_SUBD_RETURN_ERROR(false);
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (e->m_vertex[evi]->m_status.RuntimeMark())
          continue;
        e->m_vertex[evi]->m_status.SetRuntimeMark();
        if ( false == e->m_vertex[evi]->GetSubdivisionPoint(P) )
          return ON_SUBD_RETURN_ERROR(false);
        ++vertex_count;
      }
      ++edge_count;
    }
    ++face_count;
  }
  if (face_count < 1 || edge_count < 3 || vertex_count < 3)
    return false;
  if (face_count >= level0.m_face_count)
    return GlobalSubdivide();

  // Get face subdivision points
  ON_SimpleArray<ON_SubDFace*> faces(face_count);
  ON_SimpleArray<ON_3dPoint> face_points(face_count);

  // this subd is being modified.
  ChangeGeometryContentSerialNumber( false);

  for (const ON_SubDFace* f0 = level0.m_face[0]; nullptr != f0; f0 = f0->m_next_face)
  {
    if (false == f0->m_status.RuntimeMark())
      continue;
    faces.Append(const_cast<ON_SubDFace*>(f0));
    P = f0->SubdivisionPoint();
    if ( false == P.IsValid())
      return ON_SUBD_RETURN_ERROR(false);
    face_points.Append(P);
  }
  if (face_count != face_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Get edge subdivision points
  ON_SimpleArray<ON_3dPoint> edge_points(edge_count);
  ON_SimpleArray<ON_SubDEdge*> edges(edge_count);
  for (const ON_SubDEdge* e0 = level0.m_edge[0]; nullptr != e0; e0 = e0->m_next_edge)
  {
    if (false == e0->m_status.RuntimeMark())
      continue;
    P = (e0->IsSmooth() && 2 == e0->m_face_count && 2 == e0->MarkedFaceCount()) ? e0->SubdivisionPoint() : e0->ControlNetCenterPoint();
    edge_points.Append(P);
    edges.Append(const_cast<ON_SubDEdge*>(e0));
  }
  if ( edge_count != edge_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Set vertex points
  for (const ON_SubDVertex* v0 = level0.m_vertex[0]; nullptr != v0; v0 = v0->m_next_vertex)
  {
    if (false == v0->m_status.RuntimeMark() || v0->m_edge_count < 2 || ((unsigned)v0->m_edge_count) != v0->MarkedEdgeCount())
      continue;
    P = v0->SubdivisionPoint();
    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(v0);
    v->m_P[0] = P.x;
    v->m_P[1] = P.y;
    v->m_P[2] = P.z;
  }

  // split edges
  for (unsigned edex = 0; edex < edge_count; ++edex)
  {
    ON_SubDEdge* e = edges[edex];

    const ON_SubDEdgeSharpness e_sharpness = e->Sharpness(false);

    e->EdgeModifiedNofification();
    const ON_SubDEdge* new_edge = SplitEdge(e, edge_points[edex]);
    if (nullptr == new_edge)
      return ON_SUBD_RETURN_ERROR(false);
    new_edge->m_status.ClearRuntimeMark();
    e->m_status.SetRuntimeMark();

    // LOCAL subdivide is more of an add control points to an existing level
    // as opposed to a global subdivision level operation. It will be common
    // for the input to include some but not all sharp edges.
    // Dale Lear's best guess on Nov 9, 2022 is that
    // reusing the original sharpness is the best way to maximize overall
    // user happiness. This makes some sense because the level of the edges
    // is not changing in a LOCAL subdivide. 
    // It is a near certainty that some users will not like this in some cases. 
    const_cast<ON_SubDEdge*>(e)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness[0], e_sharpness.Average()));
    const_cast<ON_SubDEdge*>(new_edge)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness.Average(), e_sharpness[1]));
  }

  ON_SimpleArray<ON_SubDEdgePtr> fbdry(32);
  ON_SimpleArray<ON_SubDEdge*> radial_edges(32);
  for (unsigned fdex = 0; fdex < face_count; ++fdex)
  {
    ON_SubDFace* f = faces[fdex];
    f->FaceModifiedNofification();
    P = face_points[fdex];
    fbdry.SetCount(0);
    const unsigned e_count = f->GetEdgeArray(fbdry);
    if (e_count < 6 || 0 != e_count %2)
      return ON_SUBD_RETURN_ERROR(false);

    // Get edges[] with edge[0] = marked edges.
    const ON_SubDEdgePtr* eptrs = fbdry.Array();
    if (nullptr != eptrs[0].RelativeVertex(0) && false == eptrs[0].RelativeVertex(0)->Mark() )
    {
      fbdry.Append(eptrs[0]);
      eptrs = fbdry.Array() + 1;
    }

    // save face status and candidate_face
    unsigned int candidate_face_id = f->m_id;
    const ON_ComponentStatus fstatus = f->m_status;

    for (unsigned fei = 0; fei < e_count; ++fei)
    {
      ON_SubDEdge* e = eptrs[fei].Edge();
      if ( nullptr == e)
        return ON_SUBD_RETURN_ERROR(false);
      const ON_SubDVertex* ev[2] = { eptrs[fei].RelativeVertex(0), eptrs[fei].RelativeVertex(1) };
      if ( nullptr == ev[0] || nullptr == ev[1] || ev[0] == ev[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (0 == fei % 2)
      {
        if (false == ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (false == ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
    }

    // remove face that will be subdivided;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei)
    {
      eptrs[fei].Edge()->RemoveFaceFromArray(f);
      const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(0))->RemoveFaceFromArray(f);
    }
    ReturnFace(f);
    
    ON_SubDVertex* center = AllocateVertex(ON_SubDVertexTag::Smooth, level0_index, &P.x);
    AddVertexToLevel(center);

    radial_edges.SetCount(0);
    radial_edges.Reserve(e_count /2);
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      ON_SubDEdge* r = AddEdge(ON_SubDEdgeTag::Smooth, center, ON_SubDSectorType::UnsetSectorCoefficient, const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(1)), ON_SubDSectorType::UnsetSectorCoefficient);
      radial_edges.Append(r);
    }

    ON_SubDEdge* r[2] = { nullptr,radial_edges[e_count / 2 - 1] };
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      r[0] = r[1];
      r[1] = radial_edges[fei / 2];
      const ON_SubDEdgePtr qbdry[4] = {
        ON_SubDEdgePtr::Create(r[0],0),
        eptrs[(fei + e_count - 1) % e_count],
        eptrs[fei],
        ON_SubDEdgePtr::Create(r[1],1) 
      };
      ON_SubDFace* q = AddFace(candidate_face_id, 4, qbdry);
      candidate_face_id = 0;
      q->m_status = fstatus;
    }

  }

  level0.ClearRuntimeMarks(true, true, false);
  level0.ClearBoundingBox();
  level0.ClearEvaluationCache();
  level0.ClearEdgeFlags();

  if (nullptr != m_active_level)
    m_active_level->UpdateAllTagsAndSectorCoefficients(true);
  
  return true; 
}